

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int inflateGetHeader(z_streamp strm,gz_headerp head)

{
  int iVar1;
  int iVar2;
  
  iVar1 = inflateStateCheck(strm);
  iVar2 = -2;
  if ((iVar1 == 0) && (((ulong)strm->state->pending_buf & 2) != 0)) {
    *(gz_headerp *)&strm->state->wrap = head;
    head->done = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ZEXPORT inflateGetHeader(z_streamp strm, gz_headerp head) {
    struct inflate_state FAR *state;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if ((state->wrap & 2) == 0) return Z_STREAM_ERROR;

    /* save header structure */
    state->head = head;
    head->done = 0;
    return Z_OK;
}